

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O1

int Abc_SclCountNonBufferFanoutsInt(Abc_Obj_t *pObj)

{
  int *piVar1;
  void **ppvVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = 1;
  if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
    lVar6 = (long)(pObj->vFanouts).nSize;
    if (lVar6 < 1) {
      iVar4 = 0;
    }
    else {
      piVar1 = (pObj->vFanouts).pArray;
      ppvVar2 = pObj->pNtk->vObjs->pArray;
      lVar5 = 0;
      iVar4 = 0;
      do {
        iVar3 = Abc_SclCountNonBufferFanoutsInt((Abc_Obj_t *)ppvVar2[piVar1[lVar5]]);
        iVar4 = iVar4 + iVar3;
        lVar5 = lVar5 + 1;
      } while (lVar6 != lVar5);
    }
  }
  return iVar4;
}

Assistant:

int Abc_SclCountNonBufferFanoutsInt( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, Counter = 0;
    if ( !Abc_ObjIsBuffer(pObj) )
        return 1;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Counter += Abc_SclCountNonBufferFanoutsInt( pFanout );
    return Counter;
}